

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

Abc_Obj_t *
Abc_NodeFromIf_rec(Abc_Ntk_t *pNtkNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vCover)

{
  If_Cut_t *pCut;
  uint uVar1;
  Vec_Ptr_t *vVisited;
  word wVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pObj;
  If_Par_t *pIVar5;
  If_Obj_t *pIVar6;
  Abc_Obj_t *pAVar7;
  word *pwVar8;
  DdNode *n;
  undefined8 *puVar9;
  char *pcVar10;
  Hop_Obj_t *pHVar11;
  ulong uVar12;
  word *pwVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  word *pwVar18;
  DdManager *dd;
  Hop_Man_t *pHVar19;
  ulong uVar20;
  
  if ((Abc_Obj_t *)(pIfObj->field_22).pCopy != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pIfObj->field_22).pCopy;
  }
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("pIfObj->Type == IF_AND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                  ,0x1be,
                  "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)")
    ;
  }
  pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  pCut = &pIfObj->CutBest;
  pIVar5 = pIfMan->pPars;
  if ((((pIVar5->fDelayOpt == 0) && (pIVar5->fDelayOptLut == 0)) && (pIVar5->fDsdBalance == 0)) &&
     (((pIVar5->fUseTtPerm == 0 && (pIVar5->pLutStruct == (char *)0x0)) &&
      ((pIVar5->fUserRecLib == 0 && (pIVar5->nGateSize == 0)))))) {
    If_CutRotatePins(pIfMan,pCut);
    pIVar5 = pIfMan->pPars;
  }
  if ((pIVar5->fUseCnfs == 0) && (pIVar5->fUseMv == 0)) {
    uVar17 = 0;
    while ((uVar17 < (byte)(pIfObj->CutBest).field_0x1f &&
           (pIVar6 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar17 * 4)),
           pIVar6 != (If_Obj_t *)0x0))) {
      pAVar7 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar6,vCover);
      Abc_ObjAddFanin(pObj,pAVar7);
      uVar17 = uVar17 + 1;
    }
  }
  else {
    uVar17 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
    while ((0 < (long)uVar17 &&
           (pIVar6 = If_ManObj(pIfMan,*(int *)(&(pIfObj->CutBest).field_0x1c + uVar17 * 4)),
           pIVar6 != (If_Obj_t *)0x0))) {
      pAVar7 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar6,vCover);
      Abc_ObjAddFanin(pObj,pAVar7);
      uVar17 = uVar17 - 1;
    }
  }
  iVar3 = Abc_ObjLevelNew(pObj);
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | iVar3 << 0xc;
  pIVar5 = pIfMan->pPars;
  if (pIVar5->fTruth == 0) {
    uVar4 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    if (uVar4 < 0x2000000) {
      __assert_fail("pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                    ,0x27c,"Hop_Obj_t *Abc_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
    }
    pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
    uVar17 = 0;
    while ((uVar17 < uVar4 >> 0x18 &&
           (pIVar6 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar17 * 4)),
           pIVar6 != (If_Obj_t *)0x0))) {
      pHVar11 = Hop_IthVar(pHVar19,(int)uVar17);
      *(Hop_Obj_t **)&pIVar6->CutBest = pHVar11;
      uVar17 = uVar17 + 1;
      uVar4 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    }
    vVisited = pIfMan->vTemp;
    vVisited->nSize = 0;
    pHVar11 = Abc_NodeIfToHop2_rec(pHVar19,pIfMan,pIfObj,vVisited);
    if (pHVar11 == (Hop_Obj_t *)0x1) {
      puts("Abc_NodeIfToHop(): Computing local AIG has failed.");
      pHVar11 = (Hop_Obj_t *)0x0;
    }
    else {
      uVar17 = 0;
      while ((uVar17 < (byte)(pIfObj->CutBest).field_0x1f &&
             (pIVar6 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar17 * 4)),
             pIVar6 != (If_Obj_t *)0x0))) {
        (pIVar6->CutBest).Area = 0.0;
        (pIVar6->CutBest).Edge = 0.0;
        uVar17 = uVar17 + 1;
      }
      for (iVar3 = 0; iVar3 < pIfMan->vTemp->nSize; iVar3 = iVar3 + 1) {
        puVar9 = (undefined8 *)Vec_PtrEntry(pIfMan->vTemp,iVar3);
        *puVar9 = 0;
      }
    }
    (pObj->field_5).pData = pHVar11;
    goto LAB_00243dc8;
  }
  if (pIVar5->fUseBdds == 0) {
    if ((pIVar5->fUseCnfs != 0) || (pIVar5->fUseMv != 0)) {
      dd = (DdManager *)pNtkNew->pManFunc;
      pwVar8 = If_CutTruthW(pIfMan,pCut);
      bVar15 = (pIfObj->CutBest).field_0x1f;
      iVar3 = 1;
      goto LAB_00243d6a;
    }
    if ((pIVar5->fUseSops == 0) && (pIVar5->nGateSize < 1)) {
      if (pIVar5->fDelayOpt == 0) {
        if (pIVar5->fDsdBalance != 0) {
          pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
          iVar3 = 1;
          goto LAB_00243eca;
        }
        if (pIVar5->fUserRecLib == 0) {
          pwVar8 = If_CutTruthW(pIfMan,pCut);
          if (pIfMan->pPars->fUseTtPerm == 0) {
            uVar4 = (uint)(byte)(pIfObj->CutBest).field_0x1f;
          }
          else {
            uVar17 = 0;
            while( true ) {
              uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              uVar4 = uVar1 >> 0x18;
              if (uVar4 <= uVar17) break;
              if (((uint)(pIfObj->CutBest).uMaskFunc >> ((uint)uVar17 & 0x1f) & 1) != 0) {
                bVar15 = (byte)(uVar4 - 6) & 0x1f;
                uVar16 = 1 << bVar15;
                bVar14 = (byte)(1 << ((byte)uVar17 & 0x1f));
                if (uVar4 - 6 == 0 || uVar1 < 0x7000000) {
                  *pwVar8 = (s_Truths6[uVar17] & *pwVar8) >> (bVar14 & 0x3f) |
                            *pwVar8 << (bVar14 & 0x3f) & s_Truths6[uVar17];
                }
                else if (uVar17 < 6) {
                  if (1 << bVar15 < 1) {
                    uVar16 = 0;
                  }
                  for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
                    pwVar8[uVar12] =
                         (s_Truths6[uVar17] & pwVar8[uVar12]) >> (bVar14 & 0x3f) |
                         pwVar8[uVar12] << (bVar14 & 0x3f) & s_Truths6[uVar17];
                  }
                }
                else {
                  bVar15 = (byte)uVar17 - 6;
                  uVar4 = 1 << (bVar15 & 0x1f);
                  iVar3 = 2 << (bVar15 & 0x1f);
                  uVar12 = 0;
                  if (0 < (int)uVar4) {
                    uVar12 = (ulong)uVar4;
                  }
                  pwVar18 = pwVar8 + (int)uVar4;
                  for (pwVar13 = pwVar8; pwVar13 < pwVar8 + (int)uVar16; pwVar13 = pwVar13 + iVar3)
                  {
                    for (uVar20 = 0; uVar12 != uVar20; uVar20 = uVar20 + 1) {
                      wVar2 = pwVar13[uVar20];
                      pwVar13[uVar20] = pwVar18[uVar20];
                      pwVar18[uVar20] = wVar2;
                    }
                    pwVar18 = pwVar18 + iVar3;
                  }
                }
              }
              uVar17 = uVar17 + 1;
            }
          }
          pHVar11 = Kit_TruthToHop((Hop_Man_t *)pNtkNew->pManFunc,(uint *)pwVar8,uVar4,vCover);
        }
        else {
          pHVar11 = Abc_RecToHop3((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,pIfObj);
        }
      }
      else {
        pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
        iVar3 = 0;
LAB_00243eca:
        pHVar11 = Abc_NodeBuildFromMini(pHVar19,pIfMan,pCut,iVar3);
      }
      (pObj->field_5).pData = pHVar11;
    }
    else {
      pwVar8 = If_CutTruthW(pIfMan,pCut);
      uVar4 = Kit_TruthIsop((uint *)pwVar8,(uint)(byte)(pIfObj->CutBest).field_0x1f,vCover,1);
      if (1 < uVar4) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                      ,0x1e8,
                      "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                     );
      }
      if ((vCover->nSize == 0) ||
         ((vCover->nSize == 1 && (iVar3 = Vec_IntEntry(vCover,0), iVar3 == 0)))) {
        if (uVar4 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                        ,0x1ec,
                        "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                       );
        }
        pcVar10 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,
                                   (uint)(byte)(pIfObj->CutBest).field_0x1f,(int *)0x0);
        (pObj->field_5).pData = pcVar10;
        if (vCover->nSize == 0) {
          pObj = Abc_NtkCreateNodeConst0(pNtkNew);
        }
        else {
          pObj = Abc_NtkCreateNodeConst1(pNtkNew);
        }
      }
      else {
        pcVar10 = Abc_SopCreateFromIsop
                            ((Mem_Flex_t *)pNtkNew->pManFunc,
                             (uint)(byte)(pIfObj->CutBest).field_0x1f,vCover);
        (pObj->field_5).pData = pcVar10;
        if (uVar4 != 0) {
          Abc_SopComplement(pcVar10);
        }
      }
    }
  }
  else {
    dd = (DdManager *)pNtkNew->pManFunc;
    pwVar8 = If_CutTruthW(pIfMan,pCut);
    bVar15 = (pIfObj->CutBest).field_0x1f;
    iVar3 = 0;
LAB_00243d6a:
    n = Kit_TruthToBdd(dd,(uint *)pwVar8,(uint)bVar15,iVar3);
    (pObj->field_5).pData = n;
    Cudd_Ref(n);
  }
  if (((((pIfObj->CutBest).field_0x1d & 0x10) != 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
     (pIfMan->pPars->fDsdBalance == 0)) {
    Abc_NodeComplement(pObj);
  }
LAB_00243dc8:
  (pIfObj->field_22).pCopy = pObj;
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNodeNew;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfLeaf;
    int i;
    // return if the result if known
    pNodeNew = (Abc_Obj_t *)If_ObjCopy( pIfObj );
    if ( pNodeNew )
        return pNodeNew;
    assert( pIfObj->Type == IF_AND );
    // get the parameters of the best cut
    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    pCutBest = If_ObjCutBest( pIfObj );
//    printf( "%d 0x%02X %d\n", pCutBest->nLeaves, 0xff & *If_CutTruth(pCutBest), pIfMan->pPars->pFuncCost(pCutBest) );
//    if ( pIfMan->pPars->pLutLib && pIfMan->pPars->pLutLib->fVarPinDelays )
    if ( !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->nGateSize )
        If_CutRotatePins( pIfMan, pCutBest );
    if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
    {
        If_CutForEachLeafReverse( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    else
    {
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    // set the level of the new node
    pNodeNew->Level = Abc_ObjLevelNew( pNodeNew );
    // derive the function of this node
    if ( pIfMan->pPars->fTruth )
    {
        if ( pIfMan->pPars->fUseBdds )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 0 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 1 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseSops || pIfMan->pPars->nGateSize > 0 ) 
        {
            // transform truth table into the SOP
            int RetValue = Kit_TruthIsop( If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), vCover, 1 );
            assert( RetValue == 0 || RetValue == 1 );
            // check the case of constant cover
            if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
            {
                assert( RetValue == 0 );
                pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), NULL );
                pNodeNew = (Vec_IntSize(vCover) == 0) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew);
            }
            else
            {
                // derive the AIG for that tree
                pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), vCover );
                if ( RetValue )
                    Abc_SopComplement( (char *)pNodeNew->pData );
            }
        }
        else if ( pIfMan->pPars->fDelayOpt )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 0 );
        else if ( pIfMan->pPars->fDsdBalance )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 1 );
        else if ( pIfMan->pPars->fUserRecLib )
        {
            extern Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj );
            pNodeNew->pData = Abc_RecToHop3( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, pIfObj ); 
        }
        else
        {
            extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
            word * pTruth = If_CutTruthW(pIfMan, pCutBest);
            if ( pIfMan->pPars->fUseTtPerm )
                for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
                    if ( If_CutLeafBit(pCutBest, i) )
                        Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), i );
            pNodeNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtkNew->pManFunc, (unsigned *)pTruth, If_CutLeaveNum(pCutBest), vCover );
//            if ( pIfMan->pPars->fUseBat )
//                Bat_ManFuncPrintCell( *pTruth );
        }
        // complement the node if the cut was complemented
        if ( pCutBest->fCompl && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDsdBalance )
            Abc_NodeComplement( pNodeNew );
    }
    else
    {
        pNodeNew->pData = Abc_NodeIfToHop( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pIfObj );
    }
    If_ObjSetCopy( pIfObj, pNodeNew );
    return pNodeNew;
}